

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

CollSeq * sqlite3ExprCollSeq(Parse *pParse,Expr *pExpr)

{
  byte bVar1;
  uint uVar2;
  Expr *pEVar3;
  Expr *pEVar4;
  ExprList *pEVar5;
  char *pKey;
  CollSeq *pColl;
  sqlite3 *psVar6;
  CollSeq *pCVar7;
  long lVar8;
  
  if (pExpr != (Expr *)0x0) {
    psVar6 = pParse->db;
    while (uVar2 = pExpr->flags, (uVar2 >> 9 & 1) == 0) {
      bVar1 = pExpr->op;
      if (bVar1 < 0x98) {
        if (bVar1 == 0x25) goto switchD_0015c102_caseD_9c;
        if (bVar1 == 0x3d) goto switchD_0015c102_caseD_98;
        if (bVar1 == 0x5e) goto LAB_0015c19d;
      }
      else {
        switch(bVar1) {
        default:
          break;
        case 0x9c:
switchD_0015c102_caseD_9c:
          pEVar3 = pExpr->pLeft;
          goto LAB_0015c187;
        case 0x9d:
          if (pExpr->op2 == '^') {
LAB_0015c19d:
            pColl = sqlite3GetCollSeq(pParse,psVar6->enc,(CollSeq *)0x0,(pExpr->u).zToken);
            goto LAB_0015c1fc;
          }
        case 0x98:
        case 0x9a:
switchD_0015c102_caseD_98:
          if (pExpr->pTab != (Table *)0x0) {
            if ((long)pExpr->iColumn < 0) {
              return (CollSeq *)0x0;
            }
            pKey = pExpr->pTab->aCol[pExpr->iColumn].zColl;
            bVar1 = psVar6->enc;
            if (pKey != (char *)0x0) {
              psVar6 = (sqlite3 *)findElementWithHash(&psVar6->aCollSeq,pKey,(uint *)0x0);
            }
            if (psVar6->pDfltColl == (CollSeq *)0x0) {
              return (CollSeq *)0x0;
            }
            pColl = psVar6->pDfltColl + ((ulong)bVar1 - 1);
LAB_0015c1fc:
            if (pColl == (CollSeq *)0x0) {
              return (CollSeq *)0x0;
            }
            if (pColl->xCmp == (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) {
              pCVar7 = sqlite3GetCollSeq(pParse,pParse->db->enc,pColl,pColl->zName);
              if (pCVar7 != (CollSeq *)0x0) {
                return pColl;
              }
              return (CollSeq *)0x0;
            }
            return pColl;
          }
        }
      }
      if ((uVar2 >> 8 & 1) == 0) {
        return (CollSeq *)0x0;
      }
      pEVar3 = pExpr->pLeft;
      if ((pEVar3 == (Expr *)0x0) || ((pEVar3->flags & 0x100) == 0)) {
        pEVar4 = pExpr->pRight;
        pEVar5 = (pExpr->x).pList;
        pEVar3 = pEVar4;
        if (((uVar2 >> 0xb & 1) == 0 && pEVar5 != (ExprList *)0x0) && (0 < (long)pEVar5->nExpr)) {
          lVar8 = 0;
          do {
            pEVar3 = *(Expr **)((long)&pEVar5->a[0].pExpr + lVar8);
            if ((pEVar3->flags & 0x100) != 0) break;
            lVar8 = lVar8 + 0x20;
            pEVar3 = pEVar4;
          } while ((long)pEVar5->nExpr * 0x20 != lVar8);
        }
      }
LAB_0015c187:
      pExpr = pEVar3;
      if (pExpr == (Expr *)0x0) {
        return (CollSeq *)0x0;
      }
    }
  }
  return (CollSeq *)0x0;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3ExprCollSeq(Parse *pParse, Expr *pExpr){
  sqlite3 *db = pParse->db;
  CollSeq *pColl = 0;
  Expr *p = pExpr;
  while( p ){
    int op = p->op;
    if( p->flags & EP_Generic ) break;
    if( op==TK_CAST || op==TK_UPLUS ){
      p = p->pLeft;
      continue;
    }
    if( op==TK_COLLATE || (op==TK_REGISTER && p->op2==TK_COLLATE) ){
      pColl = sqlite3GetCollSeq(pParse, ENC(db), 0, p->u.zToken);
      break;
    }
    if( (op==TK_AGG_COLUMN || op==TK_COLUMN
          || op==TK_REGISTER || op==TK_TRIGGER)
     && p->pTab!=0
    ){
      /* op==TK_REGISTER && p->pTab!=0 happens when pExpr was originally
      ** a TK_COLUMN but was previously evaluated and cached in a register */
      int j = p->iColumn;
      if( j>=0 ){
        const char *zColl = p->pTab->aCol[j].zColl;
        pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
      }
      break;
    }
    if( p->flags & EP_Collate ){
      if( p->pLeft && (p->pLeft->flags & EP_Collate)!=0 ){
        p = p->pLeft;
      }else{
        Expr *pNext  = p->pRight;
        /* The Expr.x union is never used at the same time as Expr.pRight */
        assert( p->x.pList==0 || p->pRight==0 );
        /* p->flags holds EP_Collate and p->pLeft->flags does not.  And
        ** p->x.pSelect cannot.  So if p->x.pLeft exists, it must hold at
        ** least one EP_Collate. Thus the following two ALWAYS. */
        if( p->x.pList!=0 && ALWAYS(!ExprHasProperty(p, EP_xIsSelect)) ){
          int i;
          for(i=0; ALWAYS(i<p->x.pList->nExpr); i++){
            if( ExprHasProperty(p->x.pList->a[i].pExpr, EP_Collate) ){
              pNext = p->x.pList->a[i].pExpr;
              break;
            }
          }
        }
        p = pNext;
      }
    }else{
      break;
    }
  }
  if( sqlite3CheckCollSeq(pParse, pColl) ){ 
    pColl = 0;
  }
  return pColl;
}